

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compress_3d.cpp
# Opt level: O2

uchar * sz_compress_3d<float>
                  (float *data,size_t r1,size_t r2,size_t r3,double precision,
                  size_t *compressed_size,int BSIZE,bool block_independant)

{
  int capacity_00;
  int *__ptr;
  int *piVar1;
  ulong uVar2;
  float *pfVar3;
  uchar *indicator;
  int *piVar4;
  size_t sVar5;
  long lVar6;
  size_t __n;
  int intv_radius;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  float *reg_unpredictable_data_pos;
  float *unpredictable_data_pos;
  meanInfo<float> mean_info;
  int capacity;
  float *local_b8;
  uchar *local_b0;
  float *local_a8;
  int *local_a0;
  int *local_98;
  size_t *local_90;
  DSize_3d size;
  
  local_90 = compressed_size;
  DSize_3d::DSize_3d(&size,r1,r2,r3,BSIZE);
  capacity = 0;
  mean_info = optimize_quant_invl_3d<float>(data,r1,r2,r3,precision,&capacity);
  sVar5 = size.num_elements;
  capacity_00 = capacity;
  intv_radius = capacity >> 1;
  piVar1 = (int *)malloc(size.num_elements * 4);
  auVar7._8_4_ = (int)(sVar5 >> 0x20);
  auVar7._0_8_ = sVar5;
  auVar7._12_4_ = 0x45300000;
  dVar9 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) * 0.05 * 4.0;
  uVar2 = (ulong)dVar9;
  pfVar3 = (float *)malloc((long)(dVar9 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2);
  sVar5 = size.num_blocks;
  indicator = (uchar *)malloc(size.num_blocks);
  unpredictable_data_pos = pfVar3;
  local_b8 = pfVar3;
  piVar4 = (int *)malloc(sVar5 << 4);
  reg_unpredictable_data_pos = (float *)malloc(sVar5 << 4);
  local_a8 = reg_unpredictable_data_pos;
  local_a0 = piVar4;
  local_98 = piVar1;
  if (block_independant) {
    sVar5 = prediction_and_quantization_3d<float>
                      (data,&size,&mean_info,precision,capacity_00,intv_radius,indicator,piVar1,
                       piVar4,&reg_unpredictable_data_pos,&unpredictable_data_pos);
  }
  else {
    sVar5 = prediction_and_quantization_3d_with_border_prediction<float>
                      (data,&size,&mean_info,precision,capacity_00,intv_radius,indicator,piVar1,
                       piVar4,&reg_unpredictable_data_pos,&unpredictable_data_pos);
  }
  pfVar3 = local_b8;
  __n = (long)unpredictable_data_pos - (long)local_b8;
  lVar6 = size.num_elements << 2;
  auVar8._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar8._0_8_ = lVar6;
  auVar8._12_4_ = 0x45300000;
  dVar9 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) * 1.2;
  uVar2 = (ulong)dVar9;
  piVar4 = (int *)malloc((long)(dVar9 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2);
  *piVar4 = size.block_size;
  *(double *)(piVar4 + 1) = precision;
  *(bool *)(piVar4 + 3) = block_independant;
  *(int *)((long)piVar4 + 0xd) = intv_radius;
  *(meanInfo<float> *)((long)piVar4 + 0x11) = mean_info;
  *(size_t *)((long)piVar4 + 0x19) = sVar5;
  *(long *)((long)piVar4 + 0x21) = (long)__n >> 2;
  memcpy((uchar *)((long)piVar4 + 0x29),pfVar3,__n);
  local_b0 = (uchar *)((long)piVar4 + __n + 0x29);
  convertIntArray2ByteArray_fast_1b_to_result_sz(indicator,size.num_blocks,&local_b0);
  piVar1 = local_a0;
  pfVar3 = local_a8;
  if (sVar5 != 0) {
    encode_regression_coefficients
              (local_a0,local_a8,sVar5,(long)reg_unpredictable_data_pos - (long)local_a8 >> 2,
               &local_b0);
  }
  __ptr = local_98;
  Huffman_encode_tree_and_data((long)capacity * 2,local_98,size.num_elements,&local_b0);
  *local_90 = (long)local_b0 - (long)piVar4;
  free(indicator);
  free(local_b8);
  free(piVar1);
  free(pfVar3);
  free(__ptr);
  return (uchar *)piVar4;
}

Assistant:

unsigned char *
sz_compress_3d(const T * data, size_t r1, size_t r2, size_t r3, double precision, size_t& compressed_size, int BSIZE, bool block_independant){
	// block_independant = false;
	DSize_3d size(r1, r2, r3, BSIZE);
	int capacity = 0; // num of quant intervals
	meanInfo<T> mean_info = optimize_quant_invl_3d(data, r1, r2, r3, precision, capacity);
	int intv_radius = (capacity >> 1);
	int * type = (int *) malloc(size.num_elements * sizeof(int));
	T * unpredictable_data = (T *) malloc((0.05*size.num_elements) * sizeof(T));
	unsigned char * indicator = (unsigned char *) malloc(size.num_blocks * sizeof(unsigned char));
	T * unpredictable_data_pos = unpredictable_data;
	int * reg_params_type = (int *) malloc(RegCoeffNum3d * size.num_blocks * sizeof(int));
	float * reg_unpredictable_data = (float *) malloc(RegCoeffNum3d * size.num_blocks * sizeof(float));
	float * reg_unpredictable_data_pos = reg_unpredictable_data;
	size_t reg_count = block_independant? prediction_and_quantization_3d(data, size, mean_info, precision, capacity, intv_radius, indicator, type, reg_params_type, reg_unpredictable_data_pos, unpredictable_data_pos)
			: prediction_and_quantization_3d_with_border_prediction(data, size, mean_info, precision, capacity, intv_radius, indicator, type, reg_params_type, reg_unpredictable_data_pos, unpredictable_data_pos);
	size_t unpredictable_count = unpredictable_data_pos - unpredictable_data;
	unsigned char * compressed = NULL;
	// TODO: change to a better estimated size
	size_t est_size = size.num_elements*sizeof(T)*1.2;
	compressed = (unsigned char *) malloc(est_size);
	unsigned char * compressed_pos = compressed;
	write_variable_to_dst(compressed_pos, size.block_size);
	write_variable_to_dst(compressed_pos, precision);
	write_variable_to_dst(compressed_pos, (char) block_independant);
	write_variable_to_dst(compressed_pos, intv_radius);
	write_variable_to_dst(compressed_pos, mean_info);
	write_variable_to_dst(compressed_pos, reg_count);
	write_variable_to_dst(compressed_pos, unpredictable_count);
	write_array_to_dst(compressed_pos, unpredictable_data, unpredictable_count);
	convertIntArray2ByteArray_fast_1b_to_result_sz(indicator, size.num_blocks, compressed_pos);
	if(reg_count) encode_regression_coefficients(reg_params_type, reg_unpredictable_data, reg_count, reg_unpredictable_data_pos - reg_unpredictable_data, compressed_pos);
	Huffman_encode_tree_and_data(2*capacity, type, size.num_elements, compressed_pos);
	compressed_size = compressed_pos - compressed;
	free(indicator);
	free(unpredictable_data);
	free(reg_params_type);
	free(reg_unpredictable_data);
	free(type);
	return compressed;
}